

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 617_mergeTwoBinaryTrees.cpp
# Opt level: O1

void printnode(TreeNode *root)

{
  ostream *poVar1;
  TreeNode *in_RDI;
  queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> q;
  TreeNode *local_70;
  _Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_> local_68;
  
  local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_70 = in_RDI;
  std::_Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>::_M_initialize_map(&local_68,0);
  if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_68._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<TreeNode*,std::allocator<TreeNode*>>::_M_push_back_aux<TreeNode*const&>
              ((deque<TreeNode*,std::allocator<TreeNode*>> *)&local_68,&local_70);
  }
  else {
    *local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70;
    local_68._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_68._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_68._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_70 = *local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_70->val);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      if (local_68._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_68._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_68._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_68._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_68._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_68._M_impl.super__Deque_impl_data._M_start._M_last =
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_68._M_impl.super__Deque_impl_data._M_start._M_first =
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_68._M_impl.super__Deque_impl_data._M_start._M_node =
             local_68._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_68._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (local_70->left != (TreeNode *)0x0) {
        if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_68._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<TreeNode*,std::allocator<TreeNode*>>::_M_push_back_aux<TreeNode*const&>
                    ((deque<TreeNode*,std::allocator<TreeNode*>> *)&local_68,&local_70->left);
        }
        else {
          *local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70->left;
          local_68._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_68._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      if (local_70->right != (TreeNode *)0x0) {
        if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_68._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<TreeNode*,std::allocator<TreeNode*>>::_M_push_back_aux<TreeNode*const&>
                    ((deque<TreeNode*,std::allocator<TreeNode*>> *)&local_68,&local_70->right);
        }
        else {
          *local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70->right;
          local_68._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_68._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
    } while (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_68._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>::~_Deque_base(&local_68);
  return;
}

Assistant:

void printnode(TreeNode* root)
{
	queue<TreeNode*> q;
	q.push(root);
	while (q.empty()==false)
	{
		root = q.front();
		cout<<root->val<<", ";
		q.pop();
		if (root->left!=nullptr)
			q.push(root->left);
		if (root->right!=nullptr)
			q.push(root->right);
	}
}